

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O0

void write_crt(ubyte iobyte)

{
  ubyte iobyte_local;
  
  if (crt_sel < 0x10) {
    crt_regs[crt_sel] = iobyte;
  }
  switch(crt_sel) {
  case '\x01':
    set_colour_bits();
  case '\f':
    break;
  case '\r':
    if (teletext == '\0') {
      screen_start = ((ushort)crt_regs[0xc] * 0x100 + (ushort)crt_regs[0xd]) * 8;
      (*update_screen)();
    }
    else {
      screen_start = ((ushort)crt_regs[0xc] * 0x100 + (ushort)crt_regs[0xd] ^ 0x2000) + 0x7400;
      (*update_screen)();
    }
    break;
  case '\x0e':
    break;
  case '\x0f':
    update_cursor();
  }
  return;
}

Assistant:

void write_crt(ubyte iobyte)   // crt controller write decode function
{
    if (crt_sel <= 15)               // if a valid register for writing to
    {
        crt_regs[crt_sel] = iobyte;   // write to the register
    }

    switch (crt_sel)               // take relevant action depending on
        // register action
    {
        case 1:
            set_colour_bits();

        case 12:
            break;
        case 13:
            if (teletext) {
                screen_start = crt_regs[12] * 0x100 + crt_regs[13];
                screen_start = 0x7400 + (screen_start ^ 0x2000);
                update_screen();
            }
            else {
                screen_start = crt_regs[12] * 0x100 + crt_regs[13];
                screen_start <<= 3;
                update_screen();
            }
            break;
        case 14:
            break;
        case 15:
            update_cursor();
            break; // if the cursor address has changed,
    }                               // update the cursor.

}